

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void __thiscall
gl4cts::CopyImage::ExceedingBoundariesTest::ExceedingBoundariesTest
          (ExceedingBoundariesTest *this,Context *context)

{
  vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
  *this_00;
  GLenum GVar1;
  uint uVar2;
  long lVar3;
  GLuint GVar4;
  GLuint GVar5;
  value_type local_88;
  value_type local_60;
  ExceedingBoundariesTest *local_38;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"exceeding_boundaries",
             "Test verifies if INVALID_VALUE is generated when CopySubImageData is executed for regions exceeding image boundaries"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ExceedingBoundariesTest_01db4e00;
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  this_00 = &this->m_test_cases;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = 0xffffffff;
  local_38 = this;
  for (lVar3 = 0; lVar3 != 0x2c; lVar3 = lVar3 + 4) {
    GVar1 = *(GLenum *)((long)&s_valid_targets + lVar3);
    GVar4 = (uint)(1 < uVar2) * 3 + 1;
    GVar5 = 1;
    local_60.m_dst_y = 0;
    local_60.m_dst_z = 0;
    local_60.m_expected_result = 0;
    local_60.m_src_x = 0;
    local_60.m_src_y = 0;
    local_60.m_src_z = 0;
    local_60.m_dst_x = 0;
    local_88.m_dst_y = 0;
    local_88.m_dst_z = 0;
    local_88.m_expected_result = 0;
    local_88.m_src_x = 0;
    local_88.m_src_y = 0;
    local_88.m_src_z = 0;
    local_88.m_dst_x = 0;
    local_88.m_tex_target = GVar1;
    local_88.m_depth = GVar5;
    local_88.m_height = GVar4;
    local_60.m_tex_target = GVar1;
    local_60.m_depth = GVar5;
    local_60.m_height = GVar4;
    std::
    vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
    ::push_back(this_00,&local_60);
    std::
    vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
    ::push_back(this_00,&local_88);
    local_60.m_src_x = 0;
    local_60.m_src_y = 0xe;
    local_60.m_src_z = 0;
    local_60.m_dst_x = 0;
    local_60.m_dst_y = 0;
    local_60.m_dst_z = 0;
    local_60.m_expected_result = 0x501;
    local_88.m_src_x = 0;
    local_88.m_src_y = 0;
    local_88.m_src_z = 0;
    local_88.m_dst_x = 0;
    local_88.m_dst_y = 0xe;
    local_88.m_dst_z = 0;
    local_88.m_expected_result = 0x501;
    local_88.m_tex_target = GVar1;
    local_88.m_depth = GVar5;
    local_88.m_height = GVar4;
    local_60.m_tex_target = GVar1;
    local_60.m_depth = GVar5;
    local_60.m_height = GVar4;
    std::
    vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
    ::push_back(this_00,&local_60);
    std::
    vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
    ::push_back(this_00,&local_88);
    local_60.m_src_x = 0xe;
    local_60.m_src_y = 0;
    local_60.m_src_z = 0;
    local_60.m_dst_x = 0;
    local_60.m_dst_y = 0;
    local_60.m_dst_z = 0;
    local_60.m_expected_result = 0x501;
    local_88.m_src_x = 0;
    local_88.m_src_y = 0;
    local_88.m_src_z = 0;
    local_88.m_dst_x = 0xe;
    local_88.m_dst_y = 0;
    local_88.m_dst_z = 0;
    local_88.m_expected_result = 0x501;
    local_88.m_tex_target = GVar1;
    local_88.m_depth = GVar5;
    local_88.m_height = GVar4;
    local_60.m_tex_target = GVar1;
    local_60.m_depth = GVar5;
    local_60.m_height = GVar4;
    std::
    vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
    ::push_back(this_00,&local_60);
    std::
    vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
    ::push_back(this_00,&local_88);
    local_60.m_src_x = 0xe;
    local_60.m_src_y = 0xe;
    local_60.m_src_z = 0;
    local_60.m_dst_x = 0;
    local_60.m_dst_y = 0;
    local_60.m_dst_z = 0;
    local_60.m_expected_result = 0x501;
    local_88.m_src_x = 0;
    local_88.m_src_y = 0;
    local_88.m_src_z = 0;
    local_88.m_dst_x = 0xe;
    local_88.m_dst_y = 0xe;
    local_88.m_dst_z = 0;
    local_88.m_expected_result = 0x501;
    local_88.m_tex_target = GVar1;
    local_88.m_depth = GVar5;
    local_88.m_height = GVar4;
    local_60.m_tex_target = GVar1;
    local_60.m_depth = GVar5;
    local_60.m_height = GVar4;
    std::
    vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
    ::push_back(this_00,&local_60);
    std::
    vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
    ::push_back(this_00,&local_88);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

ExceedingBoundariesTest::ExceedingBoundariesTest(deqp::Context& context)
	: TestCase(context, "exceeding_boundaries", "Test verifies if INVALID_VALUE is generated when CopySubImageData is "
												"executed for regions exceeding image boundaries")
	, m_dst_tex_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	/* 16x16x6 are values used by prepareTex16x16x6 */
	static const GLuint invalid_x = 16 - (m_region_width / 2);
	static const GLuint invalid_y = 16 - (m_region_height / 2);
	static const GLuint invalid_z = 6 - (m_region_depth / 2);

	static const GLuint x_vals[] = { 0, invalid_x };
	static const GLuint y_vals[] = { 0, invalid_y };
	static const GLuint z_vals[] = { 0, invalid_z };

	static const GLuint n_x_vals = sizeof(x_vals) / sizeof(x_vals[0]);
	static const GLuint n_y_vals = sizeof(y_vals) / sizeof(y_vals[0]);
	static const GLuint n_z_vals = sizeof(z_vals) / sizeof(z_vals[0]);

	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];
		GLuint		 height		= m_region_height;

		if (GL_TEXTURE_BUFFER == tex_target)
		{
			continue;
		}

		if ((GL_TEXTURE_1D == tex_target) || (GL_TEXTURE_1D_ARRAY == tex_target))
		{
			height = 1;
		}

		for (GLuint x = 0; x < n_x_vals; ++x)
		{
			for (GLuint y = 0; y < n_y_vals; ++y)
			{
				for (GLuint z = 0; z < n_z_vals; ++z)
				{
					const GLuint x_val = x_vals[x];
					const GLuint y_val = y_vals[y];
					const GLuint z_val = z_vals[z];
					const GLenum res = ((0 == x_val) && (0 == y_val) && (0 == z_val)) ? GL_NO_ERROR : GL_INVALID_VALUE;
					GLuint		 depth = 1;

					if (0 != z_val)
					{
						if ((GL_TEXTURE_2D_ARRAY != tex_target) || (GL_TEXTURE_2D_MULTISAMPLE_ARRAY != tex_target) ||
							(GL_TEXTURE_3D != tex_target) || (GL_TEXTURE_CUBE_MAP_ARRAY != tex_target))
						{
							/* Skip z != 0 for 2d textures */
							continue;
						}
						else
						{
							/* Set depth so as to exceed boundary */
							depth = m_region_depth;
						}
					}

					testCase src_test_case = { tex_target, depth, height, x_val, y_val, z_val, 0, 0, 0, res };

					testCase dst_test_case = { tex_target, depth, height, 0, 0, 0, x_val, y_val, z_val, res };

					m_test_cases.push_back(src_test_case);
					m_test_cases.push_back(dst_test_case);
				}
			}
		}
	}
}